

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O0

void __thiscall binlog::Session::Session(Session *this)

{
  long in_RDI;
  ClockSync *entry;
  void *id;
  RecoverableVectorOutputStream *out;
  ClockSync clockSync;
  uint64_t in_stack_ffffffffffffffa8;
  RecoverableVectorOutputStream *in_stack_ffffffffffffffb0;
  
  std::mutex::mutex((mutex *)0x1070a1);
  entry = (ClockSync *)(in_RDI + 0x28);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::vector((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
            *)0x1070b4);
  id = (void *)(in_RDI + 0x40);
  detail::RecoverableVectorOutputStream::RecoverableVectorOutputStream
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,id);
  out = (RecoverableVectorOutputStream *)(in_RDI + 0x58);
  detail::RecoverableVectorOutputStream::RecoverableVectorOutputStream
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,id);
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 1;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  std::atomic<binlog::Severity>::atomic((atomic<binlog::Severity> *)(in_RDI + 0x88),trace);
  *(undefined1 *)(in_RDI + 0x8a) = 1;
  detail::VectorOutputStream::VectorOutputStream((VectorOutputStream *)0x107146);
  systemClockSync();
  serializeSizePrefixedTagged<binlog::ClockSync,binlog::detail::RecoverableVectorOutputStream>
            (entry,out);
  ClockSync::~ClockSync((ClockSync *)0x107171);
  return;
}

Assistant:

inline Session::Session()
{
  const ClockSync clockSync = systemClockSync();
  serializeSizePrefixedTagged(clockSync, _clockSync);
}